

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

Curve * Assimp::IFC::Curve::Convert(IfcCurve *curve,ConversionData *conv)

{
  IfcCurve **this;
  Lazy *pLVar1;
  __shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  IfcBoundedCurve *pIVar5;
  IfcPolyline *pIVar6;
  Curve *pCVar7;
  IfcCartesianPoint *pIVar8;
  IfcTrimmedCurve *pIVar9;
  IfcCurve *pIVar10;
  Curve *pCVar11;
  PrimitiveDataType<double> *pPVar12;
  IfcCurve **ppIVar13;
  IfcCompositeCurve *pIVar14;
  IfcCompositeCurveSegment *pIVar15;
  IfcConic *pIVar16;
  IfcEllipse *entity;
  undefined **ppuVar17;
  IfcLine *pIVar18;
  IfcVector *in;
  string *psVar19;
  bool bVar20;
  __shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2> *p_Var21;
  Lazy *pLVar22;
  double extraout_XMM0_Qa;
  _func_int **pp_Var23;
  double extraout_XMM0_Qa_00;
  _func_int **in_XMM1_Qa;
  Conic *local_c8;
  Entry sel;
  IfcVector3 point;
  shared_ptr<Assimp::IFC::BoundedCurve> bc;
  shared_ptr<Assimp::IFC::Curve> cv;
  
  pIVar5 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcBoundedCurve>
                     ((Object *)
                      ((long)&(curve->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(curve->super_IfcGeometricRepresentationItem).
                            super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  if (pIVar5 != (IfcBoundedCurve *)0x0) {
    pIVar6 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPolyline>
                       ((Object *)
                        ((long)&(curve->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper +
                        (long)(curve->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper[-3]));
    if (pIVar6 != (IfcPolyline *)0x0) {
      pCVar7 = (Curve *)operator_new(0x30);
      pCVar7->base_entity = (IfcCurve *)pIVar6;
      pCVar7->conv = conv;
      pCVar7->_vptr_Curve = (_func_int **)&PTR__PolyLine_00820f10;
      pCVar7[1]._vptr_Curve = (_func_int **)0x0;
      pCVar7[1].base_entity = (IfcCurve *)0x0;
      pCVar7[1].conv = (ConversionData *)0x0;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)(pCVar7 + 1),
                 *(long *)&pIVar6->field_0x58 - *(long *)&(pIVar6->super_IfcBoundedCurve).field_0x50
                 >> 3);
      sel.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      sel.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pLVar1 = *(Lazy **)&pIVar6->field_0x58;
      for (pLVar22 = *(Lazy **)&(pIVar6->super_IfcBoundedCurve).field_0x50; pLVar22 != pLVar1;
          pLVar22 = pLVar22 + 8) {
        pIVar8 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_(pLVar22);
        ConvertCartesianPoint((IfcVector3 *)&sel,pIVar8);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)(pCVar7 + 1),
                   (IfcVector3 *)&sel);
      }
      return pCVar7;
    }
    pIVar9 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcTrimmedCurve>
                       ((Object *)
                        ((long)&(curve->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper +
                        (long)(curve->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper[-3]));
    if (pIVar9 != (IfcTrimmedCurve *)0x0) {
      pCVar7 = (Curve *)operator_new(0x48);
      pCVar7->base_entity = (IfcCurve *)pIVar9;
      pCVar7->conv = conv;
      pCVar7->_vptr_Curve = (_func_int **)&PTR__TrimmedCurve_00820f78;
      pCVar7[1]._vptr_Curve = (_func_int **)0x0;
      pCVar7[1].base_entity = (IfcCurve *)0x0;
      pIVar10 = STEP::Lazy::operator_cast_to_IfcCurve_
                          ((Lazy *)&(pIVar9->super_IfcBoundedCurve).field_0x50);
      pCVar11 = Convert(pIVar10,conv);
      this = &pCVar7[2].base_entity;
      std::__shared_ptr<Assimp::IFC::Curve_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Assimp::IFC::Curve,void>
                ((__shared_ptr<Assimp::IFC::Curve_const,(__gnu_cxx::_Lock_policy)2> *)this,pCVar11);
      pCVar11 = pCVar7 + 1;
      point.z = 0.0;
      point.x = 0.0;
      point.y = 0.0;
      p_Var21 = &((pIVar9->Trim1).
                  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                  .
                  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
      ;
      p_Var2 = &((pIVar9->Trim1).
                 super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                 .
                 super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
      ;
      bVar3 = false;
      bVar20 = false;
      do {
        if (p_Var21 == p_Var2) break;
        std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&sel.
                      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ,p_Var21);
        pPVar12 = STEP::EXPRESS::DataType::ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>
                            (sel.
                             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        if (pPVar12 == (PrimitiveDataType<double> *)0x0) {
          pIVar8 = STEP::EXPRESS::DataType::
                   ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                             (sel.
                              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,conv->db);
          if (pIVar8 != (IfcCartesianPoint *)0x0) {
            bVar3 = true;
            ConvertCartesianPoint(&point,pIVar8);
          }
        }
        else {
          pCVar11->_vptr_Curve = (_func_int **)pPVar12->val;
          bVar20 = true;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sel.
                    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        p_Var21 = p_Var21 + 1;
      } while (pPVar12 == (PrimitiveDataType<double> *)0x0);
      if ((!bVar20) &&
         ((!bVar3 ||
          (iVar4 = (*((*this)->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper[4])(*this,&point,pCVar11), (char)iVar4 == '\0')))) {
        psVar19 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sel,
                   "IfcTrimmedCurve: failed to read first trim parameter, ignoring curve",
                   (allocator<char> *)&cv);
        std::__cxx11::string::string(psVar19,(string *)&sel);
        __cxa_throw(psVar19,&CurveError::typeinfo,CurveError::~CurveError);
      }
      p_Var21 = &((pIVar9->Trim2).
                  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                  .
                  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
      ;
      p_Var2 = &((pIVar9->Trim2).
                 super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                 .
                 super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
      ;
      ppIVar13 = &pCVar7[1].base_entity;
      bVar20 = false;
      bVar3 = false;
      do {
        if (p_Var21 == p_Var2) break;
        std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&sel.
                      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ,p_Var21);
        pPVar12 = STEP::EXPRESS::DataType::ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>
                            (sel.
                             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        if (pPVar12 == (PrimitiveDataType<double> *)0x0) {
          pIVar8 = STEP::EXPRESS::DataType::
                   ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                             (sel.
                              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,conv->db);
          if (pIVar8 != (IfcCartesianPoint *)0x0) {
            bVar20 = true;
            ConvertCartesianPoint(&point,pIVar8);
          }
        }
        else {
          *ppIVar13 = (IfcCurve *)pPVar12->val;
          bVar3 = true;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sel.
                    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        p_Var21 = p_Var21 + 1;
      } while (pPVar12 == (PrimitiveDataType<double> *)0x0);
      if ((!bVar3) &&
         ((!bVar20 ||
          (iVar4 = (*((*this)->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper[4])(*this,&point,ppIVar13), (char)iVar4 == '\0')))) {
        psVar19 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sel,
                   "IfcTrimmedCurve: failed to read second trim parameter, ignoring curve",
                   (allocator<char> *)&cv);
        std::__cxx11::string::string(psVar19,(string *)&sel);
        __cxa_throw(psVar19,&CurveError::typeinfo,CurveError::~CurveError);
      }
      STEP::EXPRESS::ENUMERATION::ENUMERATION((ENUMERATION *)&sel,&pIVar9->SenseAgreement);
      bVar3 = IsTrue((BOOLEAN *)&sel);
      *(bool *)&pCVar7[2]._vptr_Curve = bVar3;
      STEP::EXPRESS::
      PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~PrimitiveDataType
                ((PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&sel);
      if (*(char *)&pCVar7[2]._vptr_Curve == '\0') {
        pIVar10 = (IfcCurve *)pCVar11->_vptr_Curve;
        pCVar11->_vptr_Curve = (_func_int **)pCVar7[1].base_entity;
        pCVar7[1].base_entity = pIVar10;
      }
      iVar4 = (*((*this)->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                _vptr_ObjectHelper[2])();
      pIVar10 = *ppIVar13;
      pp_Var23 = pCVar11->_vptr_Curve;
      if (((byte)iVar4 & (double)pIVar10 < (double)pp_Var23) == 1) {
        (*((*this)->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper
          [5])();
        pIVar10 = (IfcCurve *)(ABS((double)pIVar10 - extraout_XMM0_Qa) + (double)*ppIVar13);
        *ppIVar13 = pIVar10;
        pp_Var23 = pCVar11->_vptr_Curve;
      }
      pCVar7[1].conv = (ConversionData *)((double)pIVar10 - (double)pp_Var23);
      if (0.0 <= (double)pIVar10 - (double)pp_Var23) {
        return pCVar7;
      }
      __assert_fail("maxval >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                    ,0x176,
                    "Assimp::IFC::(anonymous namespace)::TrimmedCurve::TrimmedCurve(const Schema_2x3::IfcTrimmedCurve &, ConversionData &)"
                   );
    }
    pIVar14 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCompositeCurve>
                        ((Object *)
                         ((long)&(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper +
                         (long)(curve->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]));
    if (pIVar14 != (IfcCompositeCurve *)0x0) {
      pCVar7 = (Curve *)operator_new(0x38);
      pCVar7->base_entity = (IfcCurve *)pIVar14;
      pCVar7->conv = conv;
      pCVar7->_vptr_Curve = (_func_int **)&PTR__CompositeCurve_00820fe0;
      pCVar7[1]._vptr_Curve = (_func_int **)0x0;
      pCVar7[1].base_entity = (IfcCurve *)0x0;
      pCVar7[1].conv = (ConversionData *)0x0;
      pCVar7[2]._vptr_Curve = (_func_int **)0x0;
      std::
      vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
      ::reserve((vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
                 *)(pCVar7 + 1),
                *(long *)&pIVar14->field_0x58 -
                *(long *)&(pIVar14->super_IfcBoundedCurve).field_0x50 >> 3);
      pLVar1 = *(Lazy **)&pIVar14->field_0x58;
      for (pLVar22 = *(Lazy **)&(pIVar14->super_IfcBoundedCurve).field_0x50; pLVar22 != pLVar1;
          pLVar22 = pLVar22 + 8) {
        pIVar15 = STEP::Lazy::operator_cast_to_IfcCompositeCurveSegment_(pLVar22);
        pIVar10 = STEP::Lazy::operator_cast_to_IfcCurve_((Lazy *)&pIVar15->ParentCurve);
        pCVar11 = Convert(pIVar10,conv);
        std::__shared_ptr<Assimp::IFC::Curve,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Assimp::IFC::Curve,void>
                  ((__shared_ptr<Assimp::IFC::Curve,(__gnu_cxx::_Lock_policy)2> *)&cv,pCVar11);
        std::dynamic_pointer_cast<Assimp::IFC::BoundedCurve,Assimp::IFC::Curve>
                  ((shared_ptr<Assimp::IFC::Curve> *)&bc);
        if (bc.super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4ff2bb);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&sel,
                     (string *)&(pIVar15->super_IfcGeometricRepresentationItem).field_0x30);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&sel,"CONTINUOUS");
          std::__cxx11::string::~string((string *)&sel);
          if (bVar3) {
            LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4ff23a);
          }
          STEP::EXPRESS::ENUMERATION::ENUMERATION((ENUMERATION *)&sel,&pIVar15->SameSense);
          bVar3 = IsTrue((BOOLEAN *)&sel);
          std::__shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2> *)&point,
                     &bc.super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>);
          point.z = (double)CONCAT71(point.z._1_7_,bVar3);
          std::
          vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
          ::emplace_back<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>
                    ((vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
                      *)(pCVar7 + 1),
                     (pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool> *)&point);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&point.y);
          STEP::EXPRESS::
          PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~PrimitiveDataType
                    ((PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&sel);
          (*((bc.super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Curve)._vptr_Curve[5])();
          in_XMM1_Qa = (_func_int **)
                       (ABS((double)in_XMM1_Qa - extraout_XMM0_Qa_00) +
                       (double)pCVar7[2]._vptr_Curve);
          pCVar7[2]._vptr_Curve = in_XMM1_Qa;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&bc.super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cv.super___shared_ptr<Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      if ((IfcCurve *)pCVar7[1]._vptr_Curve != pCVar7[1].base_entity) {
        return pCVar7;
      }
      psVar19 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sel,"empty composite curve",(allocator<char> *)&point);
      std::__cxx11::string::string(psVar19,(string *)&sel);
      __cxa_throw(psVar19,&CurveError::typeinfo,CurveError::~CurveError);
    }
  }
  pIVar16 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcConic>
                      ((Object *)
                       ((long)&(curve->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper +
                       (long)(curve->super_IfcGeometricRepresentationItem).
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             ._vptr_ObjectHelper[-3]));
  if (pIVar16 == (IfcConic *)0x0) {
LAB_004ff37a:
    pIVar18 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcLine>
                        ((Object *)
                         ((long)&(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper +
                         (long)(curve->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]));
    if (pIVar18 == (IfcLine *)0x0) {
      local_c8 = (Conic *)0x0;
    }
    else {
      local_c8 = (Conic *)operator_new(0x48);
      (local_c8->super_Curve).base_entity = &pIVar18->super_IfcCurve;
      (local_c8->super_Curve).conv = conv;
      (local_c8->super_Curve)._vptr_Curve = (_func_int **)&PTR__Curve_00821180;
      (local_c8->location).x = 0.0;
      (local_c8->location).y = 0.0;
      (local_c8->location).z = 0.0;
      local_c8->p[0].x = 0.0;
      local_c8->p[0].y = 0.0;
      local_c8->p[0].z = 0.0;
      pIVar8 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_
                         ((Lazy *)&(pIVar18->super_IfcCurve).field_0x40);
      ConvertCartesianPoint(&local_c8->location,pIVar8);
      in = STEP::Lazy::operator_cast_to_IfcVector_((Lazy *)&pIVar18->Dir);
      ConvertVector(local_c8->p,in);
    }
  }
  else {
    entity = (IfcEllipse *)
             STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCircle>
                       ((Object *)
                        ((long)&(curve->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper +
                        (long)(curve->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper[-3]));
    if (entity == (IfcEllipse *)0x0) {
      entity = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcEllipse>
                         ((Object *)
                          ((long)&(curve->super_IfcGeometricRepresentationItem).
                                  super_IfcRepresentationItem.
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  ._vptr_ObjectHelper +
                          (long)(curve->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper[-3]));
      if (entity == (IfcEllipse *)0x0) goto LAB_004ff37a;
      local_c8 = (Conic *)operator_new(0x80);
      anon_unknown_9::Conic::Conic(local_c8,&entity->super_IfcConic,conv);
      ppuVar17 = &PTR__Curve_00821118;
    }
    else {
      local_c8 = (Conic *)operator_new(0x80);
      anon_unknown_9::Conic::Conic(local_c8,(IfcConic *)entity,conv);
      ppuVar17 = &PTR__Curve_00821048;
    }
    (local_c8->super_Curve)._vptr_Curve = (_func_int **)ppuVar17;
    local_c8[1].super_Curve._vptr_Curve = (_func_int **)entity;
  }
  return &local_c8->super_Curve;
}

Assistant:

Curve* Curve::Convert(const IFC::Schema_2x3::IfcCurve& curve,ConversionData& conv) {
    if(curve.ToPtr<Schema_2x3::IfcBoundedCurve>()) {
        if(const Schema_2x3::IfcPolyline* c = curve.ToPtr<Schema_2x3::IfcPolyline>()) {
            return new PolyLine(*c,conv);
        }
        if(const Schema_2x3::IfcTrimmedCurve* c = curve.ToPtr<Schema_2x3::IfcTrimmedCurve>()) {
            return new TrimmedCurve(*c,conv);
        }
        if(const Schema_2x3::IfcCompositeCurve* c = curve.ToPtr<Schema_2x3::IfcCompositeCurve>()) {
            return new CompositeCurve(*c,conv);
        }
    }

    if(curve.ToPtr<Schema_2x3::IfcConic>()) {
        if(const Schema_2x3::IfcCircle* c = curve.ToPtr<Schema_2x3::IfcCircle>()) {
            return new Circle(*c,conv);
        }
        if(const Schema_2x3::IfcEllipse* c = curve.ToPtr<Schema_2x3::IfcEllipse>()) {
            return new Ellipse(*c,conv);
        }
    }

    if(const Schema_2x3::IfcLine* c = curve.ToPtr<Schema_2x3::IfcLine>()) {
        return new Line(*c,conv);
    }

    // XXX OffsetCurve2D, OffsetCurve3D not currently supported
    return NULL;
}